

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O2

uint8_t nes_system_read_ppu_byte(nes_system *system,uint16_t address)

{
  nes_cartridge *pnVar1;
  uint uVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  
  if (address < 0x2000) {
    pnVar1 = system->cartridge;
    if ((ulong)address < pnVar1->chr_rom_size) {
      uVar3 = (*pnVar1->mapper->read_chr)(pnVar1,address);
      return uVar3;
    }
    uVar3 = (system->state).chr_ram[address];
  }
  else if (address < 0x3f00) {
    uVar4 = get_ppu_nametable_address(system,address);
    uVar3 = (system->state).vram[uVar4];
  }
  else if (address < 0x4000) {
    uVar2 = 0x1f;
    if ((address & 0x13) == 0x10) {
      uVar2 = 0xc;
    }
    uVar3 = (system->state).ppu.palettes[address & uVar2];
  }
  else {
    uVar3 = '\0';
  }
  return uVar3;
}

Assistant:

static uint8_t nes_system_read_ppu_byte(nes_system* system, uint16_t address)
{ 
    if (address < 0x2000)
    {
        if (system->cartridge->chr_rom_size > address)
        {
            return system->cartridge->mapper->read_chr(system->cartridge, address);
        }
        else
        {
            return system->state.chr_ram[address];
        }
    }
    else
    {
        if (address < 0x3F00)
        {
            address = get_ppu_nametable_address(system, address);
            return system->state.vram[address];
        }
        else if (address <= 0x3FFF)
        {
            uint8_t palette_index = address & 0x1F;
            if ((palette_index & 0x13) == 0x10)
                palette_index &= ~0x10;

            return system->state.ppu.palettes[palette_index];
        }
    }

    return 0; 
}